

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
defyx::AssemblyGeneratorX86::h_FSQRT_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  ostream *poVar1;
  
  instr->dst = instr->dst & 3;
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"\tsqrtpd ");
  poVar1 = std::operator<<(poVar1,*(char **)(regE + (ulong)instr->dst * 8));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,*(char **)(regE + (ulong)instr->dst * 8));
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_FSQRT_R(Instruction& instr, int i) {
		instr.dst %= RegisterCountFlt;
		asmCode << "\tsqrtpd " << regE[instr.dst] << ", " << regE[instr.dst] << std::endl;
		traceflt(instr);
	}